

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

int vec_insert_(char **data,int *length,int *capacity,int memsz,int idx,char *alloc_category)

{
  int iVar1;
  
  iVar1 = vec_expand_(data,length,capacity,memsz,alloc_category);
  if (iVar1 == 0) {
    memmove(*data + (idx + 1) * memsz,*data + idx * memsz,(long)((*length - idx) * memsz));
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int vec_insert_(char **data, int *length, int *capacity, int memsz,
                 int idx, const char *alloc_category
) {
  int err = vec_expand_(data, length, capacity, memsz, alloc_category);
  if (err) return err;
  memmove(*data + (idx + 1) * memsz,
          *data + idx * memsz,
          (*length - idx) * memsz);
  return 0;
}